

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdphuff.c
# Opt level: O1

void jinit_phuff_decoder(j_decompress_ptr cinfo)

{
  jpeg_entropy_decoder *pjVar1;
  int (*__s) [64];
  int iVar2;
  
  pjVar1 = (jpeg_entropy_decoder *)(*cinfo->mem->alloc_small)((j_common_ptr)cinfo,1,0x68);
  cinfo->entropy = pjVar1;
  pjVar1->start_pass = start_pass_phuff_decoder;
  pjVar1[3].decode_mcu = (_func_boolean_j_decompress_ptr_JBLOCKROW_ptr *)0x0;
  *(undefined8 *)&pjVar1[3].insufficient_data = 0;
  *(undefined8 *)&pjVar1[2].insufficient_data = 0;
  pjVar1[3].start_pass = (_func_void_j_decompress_ptr *)0x0;
  __s = (int (*) [64])
        (*cinfo->mem->alloc_small)((j_common_ptr)cinfo,1,(long)cinfo->num_components << 9);
  cinfo->coef_bits = __s;
  if (0 < cinfo->num_components) {
    iVar2 = 0;
    do {
      memset(__s,0xff,0x100);
      __s = __s + 1;
      iVar2 = iVar2 + 1;
    } while (iVar2 < cinfo->num_components);
  }
  return;
}

Assistant:

GLOBAL(void)
jinit_phuff_decoder(j_decompress_ptr cinfo)
{
  phuff_entropy_ptr entropy;
  int *coef_bit_ptr;
  int ci, i;

  entropy = (phuff_entropy_ptr)
    (*cinfo->mem->alloc_small) ((j_common_ptr)cinfo, JPOOL_IMAGE,
                                sizeof(phuff_entropy_decoder));
  cinfo->entropy = (struct jpeg_entropy_decoder *)entropy;
  entropy->pub.start_pass = start_pass_phuff_decoder;

  /* Mark derived tables unallocated */
  for (i = 0; i < NUM_HUFF_TBLS; i++) {
    entropy->derived_tbls[i] = NULL;
  }

  /* Create progression status table */
  cinfo->coef_bits = (int (*)[DCTSIZE2])
    (*cinfo->mem->alloc_small) ((j_common_ptr)cinfo, JPOOL_IMAGE,
                                cinfo->num_components * 2 * DCTSIZE2 *
                                sizeof(int));
  coef_bit_ptr = &cinfo->coef_bits[0][0];
  for (ci = 0; ci < cinfo->num_components; ci++)
    for (i = 0; i < DCTSIZE2; i++)
      *coef_bit_ptr++ = -1;
}